

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O0

void __thiscall dlib::tt::tensor_rand::tensor_rand(tensor_rand *this,unsigned_long_long seed)

{
  rand *in_RDI;
  unsigned_long_long *in_stack_00000158;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  rand *in_stack_ffffffffffffffe0;
  
  rand::rand(in_RDI);
  cast_to_string<unsigned_long_long>(in_stack_00000158);
  rand::set_seed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

tensor_rand::
    tensor_rand(
        unsigned long long seed
    ) 
#ifdef DLIB_USE_CUDA
    :rnd(seed){}